

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O1

Mat_<double> * cvlfilter_zi(Mat_<double> *__return_storage_ptr__,Mat_<double> *b,Mat_<double> *a)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _InputArray local_1c8;
  _InputArray local_1b0;
  _OutputArray local_198;
  long *local_180 [2];
  Mat local_170 [96];
  Mat local_110 [96];
  Mat local_b0 [144];
  
  if ((*(int *)&b->field_0x8 != 1) || (*(int *)&a->field_0x8 != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Numerator b and Denominator a must be 1-D.",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  dVar1 = **(double **)&a->field_0x10;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    cv::operator/((Mat *)local_180,**(double **)&a->field_0x10);
    (**(code **)(*local_180[0] + 0x18))(local_180[0],(Mat *)local_180,b,6);
    cv::Mat::~Mat(local_b0);
    cv::Mat::~Mat(local_110);
    cv::Mat::~Mat(local_170);
    cv::operator/((Mat *)local_180,**(double **)&a->field_0x10);
    (**(code **)(*local_180[0] + 0x18))(local_180[0],(Mat *)local_180,a,6);
    cv::Mat::~Mat(local_b0);
    cv::Mat::~Mat(local_110);
    cv::Mat::~Mat(local_170);
  }
  iVar3 = *(int *)&a->field_0x8 * *(int *)&a->field_0xc;
  iVar4 = *(int *)&b->field_0x8 * *(int *)&b->field_0xc;
  iVar2 = iVar4;
  if (iVar4 < iVar3) {
    iVar2 = iVar3;
  }
  if (iVar3 < iVar4) {
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = -0x7efefffa;
    local_1c8.obj = a;
    cv::Mat::zeros((int)local_180,1,iVar2 - iVar3);
    cv::_InputArray::_InputArray(&local_1b0,(MatExpr *)local_180);
    local_198.super__InputArray.sz.width = 0;
    local_198.super__InputArray.sz.height = 0;
    local_198.super__InputArray.flags = -0x7dfefffa;
    local_198.super__InputArray.obj = a;
    cv::hconcat(&local_1c8,&local_1b0,&local_198);
  }
  else {
    if (iVar3 <= iVar4) goto LAB_00105c70;
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = -0x7efefffa;
    local_1c8.obj = b;
    cv::Mat::zeros((int)local_180,1,iVar2 - iVar4);
    cv::_InputArray::_InputArray(&local_1b0,(MatExpr *)local_180);
    local_198.super__InputArray.sz.width = 0;
    local_198.super__InputArray.sz.height = 0;
    local_198.super__InputArray.flags = -0x7dfefffa;
    local_198.super__InputArray.obj = b;
    cv::hconcat(&local_1c8,&local_1b0,&local_198);
  }
  cv::Mat::~Mat(local_b0);
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_170);
LAB_00105c70:
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat,0,0,6);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlfilter_zi(cv::Mat_<double> b, cv::Mat_<double> a) {
    if ((b.rows != 1) || (a.rows != 1)) {
        std::cout << "Numerator b and Denominator a must be 1-D." << std::endl;
    }
    if (a(0, 0) != 1) {
        // Normalize the coefficients so a[0] == 1.
        b = b / a(0, 0);
        a = a / a(0, 0);
    }
    int len_a = a.cols * a.rows;
    int len_b = b.cols * b.rows;
    int n = len_a > len_b ? len_a : len_b;
    if (len_a < n) {
        cv::hconcat(a, cv::Mat_<float>::zeros(1, n - len_a), a);
    } else if (len_b < n) {
        cv::hconcat(b, cv::Mat_<float>::zeros(1, n - len_b), b);
    }
    return cv::Mat_<double>(0, 0);
}